

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall ImDrawList::ClearFreeMemory(ImDrawList *this)

{
  int *piVar1;
  ImDrawCmd *pIVar2;
  unsigned_short *puVar3;
  ImDrawVert *pIVar4;
  ImVec4 *pIVar5;
  void **ppvVar6;
  ImVec2 *pIVar7;
  void *pvVar8;
  ImGuiContext *pIVar9;
  int iVar10;
  long lVar11;
  ImDrawChannel *pIVar12;
  long lVar13;
  
  pIVar2 = (this->CmdBuffer).Data;
  if (pIVar2 != (ImDrawCmd *)0x0) {
    (this->CmdBuffer).Size = 0;
    pIVar9 = GImGui;
    (this->CmdBuffer).Capacity = 0;
    piVar1 = &(GImGui->IO).MetricsAllocs;
    *piVar1 = *piVar1 + -1;
    (*(pIVar9->IO).MemFreeFn)(pIVar2);
    (this->CmdBuffer).Data = (ImDrawCmd *)0x0;
  }
  puVar3 = (this->IdxBuffer).Data;
  if (puVar3 != (unsigned_short *)0x0) {
    (this->IdxBuffer).Size = 0;
    pIVar9 = GImGui;
    (this->IdxBuffer).Capacity = 0;
    piVar1 = &(GImGui->IO).MetricsAllocs;
    *piVar1 = *piVar1 + -1;
    (*(pIVar9->IO).MemFreeFn)(puVar3);
    (this->IdxBuffer).Data = (unsigned_short *)0x0;
  }
  pIVar4 = (this->VtxBuffer).Data;
  if (pIVar4 != (ImDrawVert *)0x0) {
    (this->VtxBuffer).Size = 0;
    pIVar9 = GImGui;
    (this->VtxBuffer).Capacity = 0;
    piVar1 = &(GImGui->IO).MetricsAllocs;
    *piVar1 = *piVar1 + -1;
    (*(pIVar9->IO).MemFreeFn)(pIVar4);
    (this->VtxBuffer).Data = (ImDrawVert *)0x0;
  }
  this->_VtxCurrentIdx = 0;
  this->_VtxWritePtr = (ImDrawVert *)0x0;
  this->_IdxWritePtr = (ImDrawIdx *)0x0;
  pIVar5 = (this->_ClipRectStack).Data;
  if (pIVar5 != (ImVec4 *)0x0) {
    (this->_ClipRectStack).Size = 0;
    pIVar9 = GImGui;
    (this->_ClipRectStack).Capacity = 0;
    piVar1 = &(GImGui->IO).MetricsAllocs;
    *piVar1 = *piVar1 + -1;
    (*(pIVar9->IO).MemFreeFn)(pIVar5);
    (this->_ClipRectStack).Data = (ImVec4 *)0x0;
  }
  ppvVar6 = (this->_TextureIdStack).Data;
  if (ppvVar6 != (void **)0x0) {
    (this->_TextureIdStack).Size = 0;
    pIVar9 = GImGui;
    (this->_TextureIdStack).Capacity = 0;
    piVar1 = &(GImGui->IO).MetricsAllocs;
    *piVar1 = *piVar1 + -1;
    (*(pIVar9->IO).MemFreeFn)(ppvVar6);
    (this->_TextureIdStack).Data = (void **)0x0;
  }
  pIVar7 = (this->_Path).Data;
  if (pIVar7 != (ImVec2 *)0x0) {
    (this->_Path).Size = 0;
    pIVar9 = GImGui;
    (this->_Path).Capacity = 0;
    piVar1 = &(GImGui->IO).MetricsAllocs;
    *piVar1 = *piVar1 + -1;
    (*(pIVar9->IO).MemFreeFn)(pIVar7);
    (this->_Path).Data = (ImVec2 *)0x0;
  }
  this->_ChannelsCurrent = 0;
  this->_ChannelsCount = 1;
  iVar10 = (this->_Channels).Size;
  if (0 < iVar10) {
    lVar13 = 0;
    lVar11 = 0;
    do {
      pIVar12 = (this->_Channels).Data;
      if (lVar13 == 0) {
        (pIVar12->IdxBuffer).Size = 0;
        (pIVar12->IdxBuffer).Capacity = 0;
        (pIVar12->IdxBuffer).Data = (unsigned_short *)0x0;
        (pIVar12->CmdBuffer).Size = 0;
        (pIVar12->CmdBuffer).Capacity = 0;
        (pIVar12->CmdBuffer).Data = (ImDrawCmd *)0x0;
        iVar10 = (this->_Channels).Size;
        if (iVar10 < 1) goto LAB_0013294c;
        pIVar12 = (this->_Channels).Data;
        pIVar2 = (pIVar12->CmdBuffer).Data;
        if (pIVar2 != (ImDrawCmd *)0x0) {
          (pIVar12->CmdBuffer).Size = 0;
          pIVar9 = GImGui;
          (pIVar12->CmdBuffer).Capacity = 0;
          piVar1 = &(GImGui->IO).MetricsAllocs;
          *piVar1 = *piVar1 + -1;
          (*(pIVar9->IO).MemFreeFn)(pIVar2);
          (pIVar12->CmdBuffer).Data = (ImDrawCmd *)0x0;
          iVar10 = (this->_Channels).Size;
          if (iVar10 < 1) goto LAB_0013294c;
        }
        pIVar12 = (this->_Channels).Data;
      }
      else {
        pvVar8 = *(void **)((long)&(pIVar12->CmdBuffer).Data + lVar13);
        if (pvVar8 != (void *)0x0) {
          *(undefined8 *)((long)&(pIVar12->CmdBuffer).Size + lVar13) = 0;
          pIVar9 = GImGui;
          piVar1 = &(GImGui->IO).MetricsAllocs;
          *piVar1 = *piVar1 + -1;
          (*(pIVar9->IO).MemFreeFn)(pvVar8);
          *(undefined8 *)((long)&(pIVar12->CmdBuffer).Data + lVar13) = 0;
          iVar10 = (this->_Channels).Size;
        }
        if (iVar10 <= lVar11) {
LAB_0013294c:
          __assert_fail("i < Size",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui.h"
                        ,0x353,
                        "value_type &ImVector<ImDrawChannel>::operator[](int) [T = ImDrawChannel]");
        }
        pIVar12 = (ImDrawChannel *)((long)&(((this->_Channels).Data)->CmdBuffer).Size + lVar13);
      }
      puVar3 = (pIVar12->IdxBuffer).Data;
      if (puVar3 != (unsigned_short *)0x0) {
        (pIVar12->IdxBuffer).Size = 0;
        pIVar9 = GImGui;
        (pIVar12->IdxBuffer).Capacity = 0;
        piVar1 = &(GImGui->IO).MetricsAllocs;
        *piVar1 = *piVar1 + -1;
        (*(pIVar9->IO).MemFreeFn)(puVar3);
        (pIVar12->IdxBuffer).Data = (unsigned_short *)0x0;
        iVar10 = (this->_Channels).Size;
      }
      lVar11 = lVar11 + 1;
      lVar13 = lVar13 + 0x20;
    } while (lVar11 < iVar10);
  }
  pIVar12 = (this->_Channels).Data;
  if (pIVar12 != (ImDrawChannel *)0x0) {
    (this->_Channels).Size = 0;
    pIVar9 = GImGui;
    (this->_Channels).Capacity = 0;
    piVar1 = &(GImGui->IO).MetricsAllocs;
    *piVar1 = *piVar1 + -1;
    (*(pIVar9->IO).MemFreeFn)(pIVar12);
    (this->_Channels).Data = (ImDrawChannel *)0x0;
  }
  return;
}

Assistant:

void ImDrawList::ClearFreeMemory()
{
    CmdBuffer.clear();
    IdxBuffer.clear();
    VtxBuffer.clear();
    _VtxCurrentIdx = 0;
    _VtxWritePtr = NULL;
    _IdxWritePtr = NULL;
    _ClipRectStack.clear();
    _TextureIdStack.clear();
    _Path.clear();
    _ChannelsCurrent = 0;
    _ChannelsCount = 1;
    for (int i = 0; i < _Channels.Size; i++)
    {
        if (i == 0) memset(&_Channels[0], 0, sizeof(_Channels[0]));  // channel 0 is a copy of CmdBuffer/IdxBuffer, don't destruct again
        _Channels[i].CmdBuffer.clear();
        _Channels[i].IdxBuffer.clear();
    }
    _Channels.clear();
}